

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_conv.c
# Opt level: O0

int BN_asc2bn(BIGNUM **a,char *str)

{
  int iVar1;
  char *p;
  char *local_20;
  
  local_20 = str;
  if (*str == '-') {
    local_20 = str + 1;
  }
  if ((*local_20 == '0') && ((local_20[1] == 'X' || (local_20[1] == 'x')))) {
    iVar1 = BN_hex2bn(a,local_20 + 2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = BN_dec2bn(a,local_20);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if ((*str == '-') && ((*a)->top != 0)) {
    (*a)->neg = 1;
  }
  return 1;
}

Assistant:

int BN_asc2bn(BIGNUM **bn, const char *a)
{
    const char *p = a;

    if (*p == '-')
        p++;

    if (p[0] == '0' && (p[1] == 'X' || p[1] == 'x')) {
        if (!BN_hex2bn(bn, p + 2))
            return 0;
    } else {
        if (!BN_dec2bn(bn, p))
            return 0;
    }
    /* Don't set the negative flag if it's zero. */
    if (*a == '-' && (*bn)->top != 0)
        (*bn)->neg = 1;
    return 1;
}